

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * Mul_SV(double S,Vector *V)

{
  LASErrIdType LVar1;
  Vector *V_00;
  char *pcVar2;
  size_t sVar3;
  char *Object1Name;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    V_00 = (Vector *)malloc(0x30);
    pcVar2 = V_GetName(V);
    sVar3 = strlen(pcVar2);
    pcVar2 = (char *)malloc(sVar3 + 0x14);
    Object1Name = V_GetName(V);
    if (pcVar2 == (char *)0x0 || V_00 == (Vector *)0x0) {
      LASError(LASMemAllocErr,"Mul_SV",Object1Name,(char *)0x0,(char *)0x0);
      free(V_00);
    }
    else {
      sprintf(pcVar2,"%12.5e * (%s)",S,Object1Name);
      V_Constr(V_00,pcVar2,V->Dim,Tempor,False);
      LVar1 = LASResult();
      if (LVar1 == LASOK) {
        V_00->Multipl = S * V->Multipl;
        if ((V->Instance == Tempor) && (V->OwnData != False)) {
          V->OwnData = False;
          V_00->OwnData = True;
        }
        V_00->Cmp = V->Cmp;
      }
    }
    free(pcVar2);
  }
  else {
    V_00 = (Vector *)0x0;
  }
  V_Unlock(V);
  return V_00;
}

Assistant:

Vector *Mul_SV(double S, Vector *V)
/* VRes = S * V */
{
    Vector *VRes;

    char *VResName;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        VRes = (Vector *)malloc(sizeof(Vector));
        VResName = (char *)malloc((strlen(V_GetName(V)) + 20) * sizeof(char));
        if (VRes != NULL && VResName != NULL) {
            sprintf(VResName, "%12.5e * (%s)", S, V_GetName(V));
            V_Constr(VRes, VResName, V->Dim, Tempor, False);
            if (LASResult() == LASOK) {
                VRes->Multipl = S * V->Multipl;
                if (V->Instance == Tempor && V->OwnData) {
                    V->OwnData = False;
                    VRes->OwnData = True;
                }
                VRes->Cmp = V->Cmp;
            }
        } else {
            LASError(LASMemAllocErr, "Mul_SV", V_GetName(V), NULL, NULL);
            if (VRes != NULL)
                free(VRes);
        }
            
        if (VResName != NULL)
            free(VResName);
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}